

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O3

size_t u32CLZ_fast(u32 w)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = w >> 0x10;
  if (w < 0x10000) {
    uVar2 = w;
  }
  uVar4 = (ulong)(w < 0x10000) * 0x10;
  uVar5 = uVar4 | 8;
  uVar1 = uVar2 >> 8;
  if (uVar2 < 0x100) {
    uVar5 = uVar4 + 0x10;
    uVar1 = uVar2;
  }
  uVar4 = uVar5 - 4;
  uVar2 = uVar1 >> 4;
  if (uVar1 < 0x10) {
    uVar4 = uVar5;
    uVar2 = uVar1;
  }
  uVar1 = uVar2 >> 2;
  if (uVar2 < 4) {
    uVar1 = uVar2;
  }
  uVar5 = uVar4 - 2;
  if (uVar2 < 4) {
    uVar5 = uVar4;
  }
  lVar3 = -2;
  if (uVar1 < 2) {
    lVar3 = -(ulong)uVar1;
  }
  return lVar3 + uVar5;
}

Assistant:

size_t FAST(u32CLZ)(register u32 w)
{
	register size_t l = 32;
	register u32 t;
	// дихотомия
	if (t = w >> 16)
		l -= 16, w = t;
	if (t = w >> 8)
		l -= 8, w = t;
	if (t = w >> 4)
		l -= 4, w = t;
	if (t = w >> 2)
		l -= 2, w = t;
	// возврат
	t = 0;
	return (w >> 1) ? l - 2 : l - (w ? 1 : 0);
}